

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O2

bool_t b64IsValid(char *b64)

{
  byte *pbVar1;
  byte bVar2;
  bool_t bVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  
  bVar3 = strIsValid(b64);
  if (bVar3 == 0) {
    return 0;
  }
  sVar4 = strLen(b64);
  if ((sVar4 & 3) != 0) {
    return 0;
  }
  if (sVar4 == 0) {
    sVar4 = 0;
  }
  else {
    if (b64[sVar4 - 1] == '=') {
      sVar4 = sVar4 + ~(ulong)(b64[sVar4 - 2] == '=');
    }
    uVar5 = (uint)sVar4 & 3;
    if (uVar5 == 2) {
      bVar2 = b64_dec_table[(byte)b64[sVar4 - 1]] & 0xf;
    }
    else {
      if (uVar5 != 3) goto LAB_001175fa;
      bVar2 = b64_dec_table[(byte)b64[sVar4 - 1]] & 3;
    }
    if (bVar2 != 0) {
      return 0;
    }
    sVar4 = sVar4 - 1;
  }
LAB_001175fa:
  sVar6 = 0;
  do {
    if (sVar4 == sVar6) {
      return 1;
    }
    pbVar1 = (byte *)(b64 + sVar6);
    sVar6 = sVar6 + 1;
  } while (b64_dec_table[*pbVar1] != 0xff);
  return 0;
}

Assistant:

bool_t b64IsValid(const char* b64)
{
	size_t len;
	if (!strIsValid(b64))
		return FALSE;
	// проверить длину
	len = strLen(b64);
	if (len % 4)
		return FALSE;
	// обработать паддинг 
	if (len && b64[len - 1] == '=' && b64[--len - 1] == '=')
		--len;
	// последний блок данных из 2 октетов?
	if (len % 4 == 3)
	{
		if (b64_dec_table[(octet)b64[len - 1]] & 3)
			return FALSE;
		--len;
	}
	// последний блок данных из 1 октета?
	else if (len % 4 == 2)
	{
		if (b64_dec_table[(octet)b64[len - 1]] & 15)
			return FALSE;
		--len;
	}
	// проверить остальные символы 
	for (; len--; ++b64)
		if (b64_dec_table[(octet)*b64] == 0xFF)
			return FALSE;
	return TRUE;
}